

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::yml::anon_unknown_0::count_following_newlines
          (anon_unknown_0 *this,csubstr r,size_t *i,size_t indentation)

{
  anon_unknown_0 aVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  ulong *puVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t local_68;
  
  puVar5 = (ulong *)r.len;
  pcVar6 = r.str;
  if (pcVar6 <= (char *)*puVar5) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      sVar4 = (*pcVar2)();
      return sVar4;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  if (this[(long)*puVar5] != (anon_unknown_0)0xa) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      sVar4 = (*pcVar2)();
      return sVar4;
    }
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: r[*i] == \'\\n\'",0x1b,(anonymous_namespace)::s_default_callbacks);
  }
  pcVar8 = (char *)(*puVar5 + 1);
  *puVar5 = (ulong)pcVar8;
  if (pcVar8 < pcVar6) {
    local_68 = 0;
    do {
      aVar1 = this[(long)pcVar8];
      pcVar9 = pcVar8;
      if ((byte)aVar1 < 0xd) {
        if (aVar1 != (anon_unknown_0)0x9) {
          if (aVar1 != (anon_unknown_0)0xa) {
            return local_68;
          }
          local_68 = local_68 + 1;
          if ((i != (size_t *)0x0) && (pcVar8 < pcVar6)) {
            pcVar7 = (char *)((long)i + (long)pcVar8);
            do {
              if ((this[(long)pcVar8] != (anon_unknown_0)0x20) &&
                 (pcVar9 = pcVar8, this[(long)pcVar8] != (anon_unknown_0)0xd)) break;
              if (pcVar7 <= pcVar8) {
                if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                  pcVar2 = (code *)swi(3);
                  sVar4 = (*pcVar2)();
                  return sVar4;
                }
                (*(code *)PTR_error_impl_002a27a8)
                          ("check failed: *i < stop",0x17,(anonymous_namespace)::s_default_callbacks
                          );
              }
              pcVar8 = pcVar8 + 1;
              *puVar5 = (ulong)pcVar8;
              pcVar9 = pcVar6;
            } while (pcVar6 != pcVar8);
          }
        }
      }
      else if ((aVar1 != (anon_unknown_0)0xd) && (aVar1 != (anon_unknown_0)0x20)) {
        return local_68;
      }
      pcVar8 = pcVar9 + 1;
      *puVar5 = (ulong)pcVar8;
    } while (pcVar8 < pcVar6);
  }
  else {
    local_68 = 0;
  }
  return local_68;
}

Assistant:

size_t count_following_newlines(csubstr r, size_t *C4_RESTRICT i, size_t indentation)
{
    RYML_ASSERT(r[*i] == '\n');
    size_t numnl_following = 0;
    ++(*i);
    for( ; *i < r.len; ++(*i))
    {
        if(r.str[*i] == '\n')
        {
            ++numnl_following;
            if(indentation) // skip the indentation after the newline
            {
                size_t stop = *i + indentation;
                for( ; *i < r.len; ++(*i))
                {
                    if(r.str[*i] != ' ' && r.str[*i] != '\r')
                        break;
                    RYML_ASSERT(*i < stop);
                }
                C4_UNUSED(stop);
            }
        }
        else if(r.str[*i] == ' ' || r.str[*i] == '\t' || r.str[*i] == '\r')  // skip leading whitespace
            ;
        else
            break;
    }
    return numnl_following;
}